

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btBroadphasePair>::push_back
          (btAlignedObjectArray<btBroadphasePair> *this,btBroadphasePair *_Val)

{
  int iVar1;
  int iVar2;
  btBroadphasePair *this_00;
  btBroadphasePair *in_RSI;
  btAlignedObjectArray<btBroadphasePair> *in_RDI;
  int sz;
  undefined8 in_stack_ffffffffffffffc8;
  
  iVar1 = size(in_RDI);
  iVar2 = capacity(in_RDI);
  if (iVar1 == iVar2) {
    iVar1 = size(in_RDI);
    allocSize(in_RDI,iVar1);
    reserve(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  this_00 = (btBroadphasePair *)btBroadphasePair::operator_new(0x20,in_RDI->m_data + in_RDI->m_size)
  ;
  btBroadphasePair::btBroadphasePair(this_00,in_RSI);
  in_RDI->m_size = in_RDI->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}